

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gls::fboc::details::RenderableParams>::ParamTest
          (ParamTest<deqp::gls::fboc::details::RenderableParams> *this,Context *ctx,Params *params)

{
  ImageFormat IVar1;
  GLenum GVar2;
  RenderableParams *params_00;
  string sStack_58;
  string local_38;
  
  RenderableParams::getName_abi_cxx11_(&local_38,params,params);
  RenderableParams::getDescription_abi_cxx11_(&sStack_58,params,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e6d2e0;
  GVar2 = params->bufType;
  IVar1 = params->format;
  (this->m_params).attPoint = params->attPoint;
  (this->m_params).bufType = GVar2;
  (this->m_params).format = IVar1;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}